

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_eol
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  size_t sVar2;
  char_t *pcVar3;
  byte *s_00;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  while( true ) {
    do {
      s_00 = (byte *)s;
      sVar2 = local_38.size;
      bVar1 = *s_00;
      s = (char_t *)(s_00 + 1);
    } while (((anonymous_namespace)::chartype_table[bVar1] & 2) == 0);
    if (bVar1 == end_quote) break;
    if (bVar1 == 0xd) {
      *s_00 = 10;
      if (s_00[1] == 10) {
        if ((byte *)local_38.end != (byte *)0x0) {
          if (s < local_38.end) {
            __assert_fail("s >= end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                          ,0x634,
                          "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)");
          }
          memmove(local_38.end + -local_38.size,local_38.end,(long)s - (long)local_38.end);
        }
        local_38.end = (char_t *)(s_00 + 2);
        local_38.size = sVar2 + 1;
        s = local_38.end;
      }
    }
    else if (bVar1 == 0) {
      return (char_t *)0x0;
    }
  }
  pcVar3 = gap::flush(&local_38,(char_t *)s_00);
  *pcVar3 = '\0';
  return (char_t *)(byte *)s;
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				while (!PUGI__IS_CHARTYPE(*s, ct_parse_attr)) ++s;
				
				if (*s == end_quote)
				{
					*g.flush(s) = 0;
				
					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';
					
					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}